

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int aom_noise_model_init(aom_noise_model_t *model,aom_noise_model_params_t params)

{
  aom_noise_model_params_t params_00;
  int iVar1;
  int iVar2;
  void *pvVar3;
  ulong in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  int max_x;
  int c;
  int i;
  int y;
  int x;
  int bit_depth;
  int lag;
  int n;
  uint local_44;
  int in_stack_ffffffffffffffc0;
  uint n_00;
  int iVar4;
  undefined4 uVar5;
  int local_30;
  uint local_14;
  uint uStack_10;
  int local_c;
  int iStack_8;
  int local_4;
  
  local_14 = (uint)in_RSI;
  uStack_10 = (uint)(in_RSI >> 0x20);
  local_c = (int)in_RDX;
  iStack_8 = (int)(in_RDX >> 0x20);
  params_00.bit_depth = local_c;
  params_00._0_8_ = in_RSI;
  params_00.use_highbd = iStack_8;
  iVar1 = num_coeffs(params_00);
  uVar5 = 0;
  iVar4 = 0;
  memset(in_RDI,0,0x2c0);
  if ((int)uStack_10 < 1) {
    fprintf(_stderr,"Invalid noise param: lag = %d must be >= 1\n",(ulong)uStack_10);
    local_4 = 0;
  }
  else if ((int)uStack_10 < 5) {
    if (((local_c == 8) || (local_c == 10)) || (local_c == 0xc)) {
      *in_RDI = in_RSI;
      in_RDI[1] = in_RDX;
      for (n_00 = 0; (int)n_00 < 3; n_00 = n_00 + 1) {
        iVar2 = noise_state_init((aom_noise_state_t *)CONCAT44(uVar5,iVar4),n_00,
                                 in_stack_ffffffffffffffc0);
        if (iVar2 == 0) {
          fprintf(_stderr,"Failed to allocate noise state for channel %d\n",(ulong)n_00);
          aom_noise_model_free((aom_noise_model_t *)CONCAT44(n_00,in_stack_ffffffffffffffc0));
          return 0;
        }
        iVar2 = noise_state_init((aom_noise_state_t *)CONCAT44(uVar5,iVar4),n_00,
                                 in_stack_ffffffffffffffc0);
        if (iVar2 == 0) {
          fprintf(_stderr,"Failed to allocate noise state for channel %d\n",(ulong)n_00);
          aom_noise_model_free((aom_noise_model_t *)CONCAT44(n_00,in_stack_ffffffffffffffc0));
          return 0;
        }
      }
      *(int *)(in_RDI + 0x57) = iVar1;
      pvVar3 = aom_malloc(0x3b7acb);
      in_RDI[0x56] = (ulong)pvVar3;
      if (in_RDI[0x56] == 0) {
        aom_noise_model_free((aom_noise_model_t *)CONCAT44(n_00,in_stack_ffffffffffffffc0));
        local_4 = 0;
      }
      else {
        for (iVar1 = -uStack_10; iVar1 < 1; iVar1 = iVar1 + 1) {
          if (iVar1 == 0) {
            local_44 = 0xffffffff;
          }
          else {
            local_44 = uStack_10;
          }
          for (local_30 = -uStack_10; local_30 <= (int)local_44; local_30 = local_30 + 1) {
            if ((in_RSI & 0xff) == 0) {
              iVar2 = local_30;
              if (local_30 < 1) {
                iVar2 = -local_30;
              }
              if (iVar2 <= (int)(iVar1 + uStack_10)) {
                *(int *)(in_RDI[0x56] + (long)iVar4 * 8) = local_30;
                *(int *)(in_RDI[0x56] + 4 + (long)iVar4 * 8) = iVar1;
                iVar4 = iVar4 + 1;
              }
            }
            else {
              if ((local_14 & 0xff) != 1) {
                fprintf(_stderr,"Invalid shape\n");
                aom_noise_model_free((aom_noise_model_t *)CONCAT44(n_00,local_44));
                return 0;
              }
              *(int *)(in_RDI[0x56] + (long)iVar4 * 8) = local_30;
              *(int *)(in_RDI[0x56] + 4 + (long)iVar4 * 8) = iVar1;
              iVar4 = iVar4 + 1;
            }
          }
        }
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    fprintf(_stderr,"Invalid noise param: lag = %d must be <= %d\n",(ulong)uStack_10,4);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int aom_noise_model_init(aom_noise_model_t *model,
                         const aom_noise_model_params_t params) {
  const int n = num_coeffs(params);
  const int lag = params.lag;
  const int bit_depth = params.bit_depth;
  int x = 0, y = 0, i = 0, c = 0;

  memset(model, 0, sizeof(*model));
  if (params.lag < 1) {
    fprintf(stderr, "Invalid noise param: lag = %d must be >= 1\n", params.lag);
    return 0;
  }
  if (params.lag > kMaxLag) {
    fprintf(stderr, "Invalid noise param: lag = %d must be <= %d\n", params.lag,
            kMaxLag);
    return 0;
  }
  if (!(params.bit_depth == 8 || params.bit_depth == 10 ||
        params.bit_depth == 12)) {
    return 0;
  }

  memcpy(&model->params, &params, sizeof(params));
  for (c = 0; c < 3; ++c) {
    if (!noise_state_init(&model->combined_state[c], n + (c > 0), bit_depth)) {
      fprintf(stderr, "Failed to allocate noise state for channel %d\n", c);
      aom_noise_model_free(model);
      return 0;
    }
    if (!noise_state_init(&model->latest_state[c], n + (c > 0), bit_depth)) {
      fprintf(stderr, "Failed to allocate noise state for channel %d\n", c);
      aom_noise_model_free(model);
      return 0;
    }
  }
  model->n = n;
  model->coords = (int(*)[2])aom_malloc(sizeof(*model->coords) * n);
  if (!model->coords) {
    aom_noise_model_free(model);
    return 0;
  }

  for (y = -lag; y <= 0; ++y) {
    const int max_x = y == 0 ? -1 : lag;
    for (x = -lag; x <= max_x; ++x) {
      switch (params.shape) {
        case AOM_NOISE_SHAPE_DIAMOND:
          if (abs(x) <= y + lag) {
            model->coords[i][0] = x;
            model->coords[i][1] = y;
            ++i;
          }
          break;
        case AOM_NOISE_SHAPE_SQUARE:
          model->coords[i][0] = x;
          model->coords[i][1] = y;
          ++i;
          break;
        default:
          fprintf(stderr, "Invalid shape\n");
          aom_noise_model_free(model);
          return 0;
      }
    }
  }
  assert(i == n);
  return 1;
}